

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

void iCopyPaletted<cBGRA,bBlend>
               (BYTE *buffer,BYTE *patch,int srcwidth,int srcheight,int Pitch,int step_x,int step_y,
               int rotate,PalEntry *palette,FCopyInfo *inf)

{
  byte bVar1;
  BYTE BVar2;
  int iVar3;
  byte *pbVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  if (0 < srcheight) {
    uVar6 = 0;
    iVar3 = 0;
    do {
      if (0 < srcwidth) {
        lVar7 = (long)iVar3;
        uVar5 = 0;
        pbVar4 = patch;
        do {
          bVar1 = *pbVar4;
          BVar2 = palette[bVar1].field_0.field_0.a;
          if (BVar2 != '\0') {
            buffer[uVar5 * 4 + lVar7 + 2] =
                 (BYTE)((uint)palette[bVar1].field_0.field_0.r * inf->alpha +
                        (uint)buffer[uVar5 * 4 + lVar7 + 2] * inf->invalpha >> 0x10);
            buffer[uVar5 * 4 + lVar7 + 1] =
                 (BYTE)((uint)palette[bVar1].field_0.field_0.g * inf->alpha +
                        (uint)buffer[uVar5 * 4 + lVar7 + 1] * inf->invalpha >> 0x10);
            buffer[uVar5 * 4 + lVar7] =
                 (BYTE)((uint)palette[bVar1].field_0.field_0.b * inf->alpha +
                        (uint)buffer[uVar5 * 4 + lVar7] * inf->invalpha >> 0x10);
            buffer[uVar5 * 4 + lVar7 + 3] = BVar2;
          }
          uVar5 = uVar5 + 1;
          pbVar4 = pbVar4 + step_x;
        } while ((uint)srcwidth != uVar5);
      }
      uVar6 = uVar6 + 1;
      iVar3 = iVar3 + Pitch;
      patch = patch + step_y;
    } while (uVar6 != (uint)srcheight);
  }
  return;
}

Assistant:

void iCopyPaletted(BYTE *buffer, const BYTE * patch, int srcwidth, int srcheight, int Pitch,
					int step_x, int step_y, int rotate, PalEntry * palette, FCopyInfo *inf)
{
	int x,y,pos;

	for (y=0;y<srcheight;y++)
	{
		pos = y*Pitch;
		for (x=0;x<srcwidth;x++,pos+=4)
		{
			int v=(unsigned char)patch[y*step_y+x*step_x];
			int a = palette[v].a;

			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(buffer[pos + TDest::RED], palette[v].r, a, inf);
				TBlend::OpC(buffer[pos + TDest::GREEN], palette[v].g, a, inf);
				TBlend::OpC(buffer[pos + TDest::BLUE], palette[v].b, a, inf);
				TBlend::OpA(buffer[pos + TDest::ALPHA], a, inf);
			}
		}
	}
}